

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_geometry.cpp
# Opt level: O0

ON_ModelGeometryComponent * __thiscall
ON_ModelGeometryComponent::operator=(ON_ModelGeometryComponent *this,ON_ModelGeometryComponent *src)

{
  Type TVar1;
  ON_ModelGeometryComponent *src_local;
  ON_ModelGeometryComponent *this_local;
  
  if (this != src) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&src->super_ON_ModelComponent);
    std::__shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>);
    std::shared_ptr<ON_Geometry>::operator=(&this->m_geometry_sp,&src->m_geometry_sp);
    std::__shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_attributes_sp).
                super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>);
    std::shared_ptr<ON_3dmObjectAttributes>::operator=(&this->m_attributes_sp,&src->m_attributes_sp)
    ;
    TVar1 = ON_ModelComponent::ComponentType(&src->super_ON_ModelComponent);
    TVar1 = Internal_ON_ModelGeometry_TypeFilter(TVar1);
    ON_ModelComponent::SetComponentType(&this->super_ON_ModelComponent,TVar1);
  }
  return this;
}

Assistant:

ON_ModelGeometryComponent& ON_ModelGeometryComponent::operator=(const ON_ModelGeometryComponent& src)
{
  if ( this != &src )
  {
    ON_ModelComponent::operator=(src);
    m_geometry_sp.reset();
    m_geometry_sp = src.m_geometry_sp;
    m_attributes_sp.reset();
    m_attributes_sp = src.m_attributes_sp;
    SetComponentType(Internal_ON_ModelGeometry_TypeFilter(src.ComponentType()));
  }
  return *this;
}